

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

void Diligent::GLSLangUtils::anon_unknown_4::SetupWithSpirvVersion
               (TShader *Shader,EProfile *shProfile,EShLanguage ShLang,SpirvVersion Version,
               EShSource ShSource)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  EShSource ShSource_local;
  SpirvVersion Version_local;
  EShLanguage ShLang_local;
  EProfile *shProfile_local;
  TShader *Shader_local;
  
  *shProfile = ENoProfile;
  msg.field_2._12_4_ = ShSource;
  switch(Version) {
  case Vk100:
    glslang::TShader::setEnvInput(Shader,ShSource,ShLang,EShClientVulkan,100);
    glslang::TShader::setEnvClient(Shader,EShClientVulkan,EShTargetVulkan_1_0);
    glslang::TShader::setEnvTarget(Shader,EShTargetSpv,EShTargetSpv_1_0);
    break;
  case Vk110:
    glslang::TShader::setEnvInput(Shader,ShSource,ShLang,EShClientVulkan,0x6e);
    glslang::TShader::setEnvClient(Shader,EShClientVulkan,EShTargetVulkan_1_1);
    glslang::TShader::setEnvTarget(Shader,EShTargetSpv,EShTargetSpv_1_3);
    break;
  case Vk110_Spirv14:
    glslang::TShader::setEnvInput(Shader,ShSource,ShLang,EShClientVulkan,0x6e);
    glslang::TShader::setEnvClient(Shader,EShClientVulkan,EShTargetVulkan_1_1);
    glslang::TShader::setEnvTarget(Shader,EShTargetSpv,EShTargetSpv_1_4);
    break;
  case Vk120:
    glslang::TShader::setEnvInput(Shader,ShSource,ShLang,EShClientVulkan,0x78);
    glslang::TShader::setEnvClient(Shader,EShClientVulkan,EShTargetVulkan_1_2);
    glslang::TShader::setEnvTarget(Shader,EShTargetSpv,EShTargetSpv_1_5);
    break;
  case GL:
    glslang::TShader::setEnvInput(Shader,ShSource,ShLang,EShClientOpenGL,0x1c2);
    glslang::TShader::setEnvClient(Shader,EShClientOpenGL,EShTargetOpenGL_450);
    glslang::TShader::setEnvTarget(Shader,EShTargetSpv,EShTargetSpv_1_0);
    *shProfile = ECoreProfile;
    break;
  case GLES:
    glslang::TShader::setEnvInput(Shader,ShSource,ShLang,EShClientOpenGL,0x1c2);
    glslang::TShader::setEnvClient(Shader,EShClientOpenGL,EShTargetOpenGL_450);
    glslang::TShader::setEnvTarget(Shader,EShTargetSpv,EShTargetSpv_1_0);
    *shProfile = EEsProfile;
    break;
  default:
    FormatString<char[22]>((string *)local_48,(char (*) [22])"Unknown SPIRV version");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetupWithSpirvVersion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x192);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void SetupWithSpirvVersion(::glslang::TShader&  Shader,
                           ::EProfile&          shProfile,
                           EShLanguage          ShLang,
                           SpirvVersion         Version,
                           ::glslang::EShSource ShSource)
{
    static_assert(static_cast<int>(SpirvVersion::Count) == 6, "Did you add a new member to SpirvVersion? You may need to handle it here.");

    shProfile = EProfile::ENoProfile;
    switch (Version)
    {
        case SpirvVersion::Vk100:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 100);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_0);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_0);
            break;
        case SpirvVersion::Vk110:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 110);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_1);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_3);
            break;
        case SpirvVersion::Vk110_Spirv14:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 110);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_1);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_4);
            break;
        case SpirvVersion::Vk120:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientVulkan, 120);
            Shader.setEnvClient(::glslang::EShClientVulkan, ::glslang::EShTargetVulkan_1_2);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_5);
            break;

        case SpirvVersion::GL:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientOpenGL, 450);
            Shader.setEnvClient(::glslang::EShClientOpenGL, ::glslang::EShTargetOpenGL_450);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_0);
            shProfile = EProfile::ECoreProfile;
            break;
        case SpirvVersion::GLES:
            Shader.setEnvInput(ShSource, ShLang, ::glslang::EShClientOpenGL, 450);
            Shader.setEnvClient(::glslang::EShClientOpenGL, ::glslang::EShTargetOpenGL_450);
            Shader.setEnvTarget(::glslang::EShTargetSpv, ::glslang::EShTargetSpv_1_0);
            shProfile = EProfile::EEsProfile;
            break;

        default:
            UNEXPECTED("Unknown SPIRV version");
    }
}